

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_file.cpp
# Opt level: O1

bool FindEitherActiveRuntimeFilename
               (char *prefix_desc,string *rt_dir_prefix,uint16_t major_version,string *out)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  bool bVar4;
  bool bVar5;
  size_t sVar6;
  long *plVar7;
  size_type *psVar8;
  undefined6 in_register_00000012;
  string *psVar9;
  string __str;
  ostringstream oss;
  undefined1 auStack_218 [8];
  string local_210;
  string local_1f0;
  string *local_1d0;
  vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> local_1c8;
  string local_1a8 [3];
  ios_base local_138 [264];
  
  psVar9 = (string *)CONCAT62(in_register_00000012,major_version);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "Looking for active_runtime.x86_64.json or active_runtime.json in ",0x41);
  if (prefix_desc == (char *)0x0) {
    std::ios::clear((int)auStack_218 + (int)*(undefined8 *)(local_1a8[0]._M_dataplus._M_p + -0x18) +
                    0x70);
  }
  else {
    sVar6 = strlen(prefix_desc);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,prefix_desc,sVar6);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,": ",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,(rt_dir_prefix->_M_dataplus)._M_p,rt_dir_prefix->_M_string_length)
  ;
  paVar1 = &local_210.field_2;
  local_210._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"");
  std::__cxx11::stringbuf::str();
  local_1c8.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  LoaderLogger::LogInfoMessage(&local_210,&local_1f0,&local_1c8);
  std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector(&local_1c8);
  paVar2 = &local_1f0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != paVar2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != paVar1) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  local_1f0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct((ulong)&local_1f0,'\x01');
  *local_1f0._M_dataplus._M_p = '1';
  plVar7 = (long *)std::__cxx11::string::replace
                             ((ulong)&local_1f0,0,(char *)0x0,
                              (ulong)(rt_dir_prefix->_M_dataplus)._M_p);
  psVar8 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_210.field_2._M_allocated_capacity = *psVar8;
    local_210.field_2._8_8_ = plVar7[3];
    local_210._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_210.field_2._M_allocated_capacity = *psVar8;
    local_210._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_210._M_string_length = plVar7[1];
  *plVar7 = (long)psVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_210);
  paVar3 = &local_1a8[0].field_2;
  psVar8 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_1a8[0].field_2._0_8_ = *psVar8;
    local_1a8[0].field_2._8_8_ = plVar7[3];
    local_1a8[0]._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_1a8[0].field_2._0_8_ = *psVar8;
    local_1a8[0]._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_1a8[0]._M_string_length = plVar7[1];
  *plVar7 = (long)psVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != paVar1) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != paVar2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  bVar4 = FileSysUtilsPathExists(local_1a8);
  if (bVar4) {
    std::__cxx11::string::_M_assign(psVar9);
  }
  local_1d0 = psVar9;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != paVar3) {
    operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
  }
  bVar5 = true;
  if (!bVar4) {
    local_1f0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct((ulong)&local_1f0,'\x01');
    *local_1f0._M_dataplus._M_p = '1';
    plVar7 = (long *)std::__cxx11::string::replace
                               ((ulong)&local_1f0,0,(char *)0x0,
                                (ulong)(rt_dir_prefix->_M_dataplus)._M_p);
    psVar8 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_210.field_2._M_allocated_capacity = *psVar8;
      local_210.field_2._8_8_ = plVar7[3];
      local_210._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_210.field_2._M_allocated_capacity = *psVar8;
      local_210._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_210._M_string_length = plVar7[1];
    *plVar7 = (long)psVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_210);
    psVar8 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_1a8[0].field_2._0_8_ = *psVar8;
      local_1a8[0].field_2._8_8_ = plVar7[3];
      local_1a8[0]._M_dataplus._M_p = (pointer)paVar3;
    }
    else {
      local_1a8[0].field_2._0_8_ = *psVar8;
      local_1a8[0]._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_1a8[0]._M_string_length = plVar7[1];
    *plVar7 = (long)psVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != paVar1) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != paVar2) {
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
    bVar5 = FileSysUtilsPathExists(local_1a8);
    if (bVar5) {
      std::__cxx11::string::_M_assign(local_1d0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p != paVar3) {
      operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
    }
  }
  return bVar5;
}

Assistant:

static bool FindEitherActiveRuntimeFilename(const char *prefix_desc, const std::string &rt_dir_prefix, uint16_t major_version,
                                            std::string &out) {
    {
        std::ostringstream oss;
        oss << "Looking for active_runtime." XR_ARCH_ABI ".json or active_runtime.json in ";
        oss << prefix_desc;
        oss << ": ";
        oss << rt_dir_prefix;

        LoaderLogger::LogInfoMessage("", oss.str());
    }
    {
        auto decorated_path = rt_dir_prefix + std::to_string(major_version) + "/active_runtime." XR_ARCH_ABI ".json";

        if (FileSysUtilsPathExists(decorated_path)) {
            out = decorated_path;
            return true;
        }
    }
    {
        auto undecorated_path = rt_dir_prefix + std::to_string(major_version) + "/active_runtime.json";

        if (FileSysUtilsPathExists(undecorated_path)) {
            out = undecorated_path;
            return true;
        }
    }
    return false;
}